

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int findIndexCol(Parse *pParse,ExprList *pList,int iBase,Index *pIdx,int iCol)

{
  u8 uVar1;
  byte bVar2;
  byte *pbVar3;
  Expr *pExpr;
  Expr *pEVar4;
  CollSeq *pCVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < pList->nExpr) {
    pbVar3 = (byte *)pIdx->azColl[iCol];
    lVar9 = 0;
    do {
      pExpr = pList->a[lVar9].pExpr;
      for (pEVar4 = pExpr; (uVar1 = pEVar4->op, uVar1 == '\x18' || (uVar1 == '\\'));
          pEVar4 = pEVar4->pLeft) {
      }
      if ((((uVar1 == 0x98) && (pIdx->aiColumn[iCol] == (int)pEVar4->iColumn)) &&
          (pEVar4->iTable == iBase)) &&
         (pCVar5 = sqlite3ExprCollSeq(pParse,pExpr), pCVar5 != (CollSeq *)0x0)) {
        pbVar7 = (byte *)pCVar5->zName;
        bVar2 = *pbVar7;
        pbVar6 = pbVar3;
        while (bVar2 != 0) {
          uVar8 = (ulong)bVar2;
          pbVar7 = pbVar7 + 1;
          if (""[uVar8] != ""[*pbVar6]) goto LAB_00198214;
          pbVar6 = pbVar6 + 1;
          bVar2 = *pbVar7;
        }
        uVar8 = 0;
LAB_00198214:
        if (""[uVar8] == ""[*pbVar6]) {
          return (int)lVar9;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pList->nExpr);
  }
  return -1;
}

Assistant:

static int findIndexCol(
  Parse *pParse,                  /* Parse context */
  ExprList *pList,                /* Expression list to search */
  int iBase,                      /* Cursor for table associated with pIdx */
  Index *pIdx,                    /* Index to match column of */
  int iCol                        /* Column of index to match */
){
  int i;
  const char *zColl = pIdx->azColl[iCol];

  for(i=0; i<pList->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollate(pList->a[i].pExpr);
    if( p->op==TK_COLUMN
     && p->iColumn==pIdx->aiColumn[iCol]
     && p->iTable==iBase
    ){
      CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[i].pExpr);
      if( ALWAYS(pColl) && 0==sqlite3StrICmp(pColl->zName, zColl) ){
        return i;
      }
    }
  }

  return -1;
}